

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxBitOp::Emit(FxBitOp *this,VMFunctionBuilder *build)

{
  int iVar1;
  FxExpression *pFVar2;
  uint uVar3;
  ExpEmit EVar4;
  ExpEmit EVar5;
  uint uVar6;
  uint uVar7;
  ExpEmit EVar8;
  ExpEmit EVar9;
  ExpEmit local_40;
  ExpEmit local_38;
  uint extraout_var;
  uint extraout_var_00;
  
  pFVar2 = (this->super_FxBinary).left;
  if (pFVar2->ValueType->RegType != '\0') {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5e,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  if (((this->super_FxBinary).right)->ValueType->RegType != '\0') {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5f,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  EVar4._0_4_ = (*pFVar2->_vptr_FxExpression[9])();
  EVar4.Konst = (bool)(char)extraout_var;
  EVar4.Fixed = (bool)(char)(extraout_var >> 8);
  EVar4.Final = (bool)(char)(extraout_var >> 0x10);
  EVar4.Target = (bool)(char)(extraout_var >> 0x18);
  pFVar2 = (this->super_FxBinary).right;
  local_38 = EVar4;
  EVar5._0_4_ = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
  EVar5.Konst = (bool)(char)extraout_var_00;
  EVar5.Fixed = (bool)(char)(extraout_var_00 >> 8);
  EVar5.Final = (bool)(char)(extraout_var_00 >> 0x10);
  EVar5.Target = (bool)(char)(extraout_var_00 >> 0x18);
  EVar8 = EVar4;
  uVar7 = extraout_var;
  uVar6 = EVar5._0_4_;
  local_40 = EVar4;
  uVar3 = extraout_var_00;
  if ((extraout_var & 1) == 0) {
    EVar8.Konst = false;
    EVar8.Fixed = false;
    EVar8.Final = false;
    EVar8.Target = false;
    EVar8.RegNum = (short)EVar5._0_4_;
    EVar8.RegType = (char)(EVar5._0_4_ >> 0x10);
    EVar8.RegCount = (char)(EVar5._0_4_ >> 0x18);
    uVar7 = extraout_var_00;
    uVar6 = EVar4._0_4_;
    local_40 = EVar5;
    EVar5 = local_38;
    uVar3 = extraout_var;
  }
  local_38 = EVar5;
  if ((uVar3 & 1) != 0) {
    __assert_fail("!op1.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe69,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::Free(&local_40,build);
  ExpEmit::Free(&local_38,build);
  iVar1 = (this->super_FxBinary).Operator;
  if (iVar1 == 0x26) {
    iVar1 = 0x77;
  }
  else if (iVar1 == 0x5e) {
    iVar1 = 0x7b;
  }
  else {
    if (iVar1 != 0x7c) {
      __assert_fail("instr > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xe72,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
    }
    iVar1 = 0x79;
  }
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  VMFunctionBuilder::Emit
            (build,(uVar7 & 0xff) + iVar1,uVar3 & 0xffff,uVar6 & 0xffff,EVar8._0_4_ & 0xffff);
  EVar9._0_4_ = uVar3 & 0xffff | 0x1000000;
  EVar9.Konst = false;
  EVar9.Fixed = false;
  EVar9.Final = false;
  EVar9.Target = false;
  return EVar9;
}

Assistant:

ExpEmit FxBitOp::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	int instr, rop;
	ExpEmit op1, op2;

	op1 = left->Emit(build);
	op2 = right->Emit(build);
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);
	rop = op2.RegNum;
	op2.Free(build);
	op1.Free(build);

	instr = Operator == '&' ? OP_AND_RR :
			Operator == '|' ? OP_OR_RR :
			Operator == '^' ? OP_XOR_RR : -1;

	assert(instr > 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr + op2.Konst, to.RegNum, op1.RegNum, rop);
	return to;
}